

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O0

void helicsFederateSetLoggingCallback
               (HelicsFederate fed,_func_void_int_char_ptr_char_ptr_void_ptr *logger,void *userdata,
               HelicsError *err)

{
  Federate *pFVar1;
  long in_RSI;
  Federate *fedptr;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff70;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffffa8;
  Federate *in_stack_ffffffffffffffb0;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == 0) {
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::function(in_stack_ffffffffffffff60);
      helics::Federate::setLoggingCallback(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f0c26);
    }
    else {
      std::
      function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
      ::function<helicsFederateSetLoggingCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_121d9f3e *)in_stack_ffffffffffffff68);
      helics::Federate::setLoggingCallback(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f0c99);
    }
  }
  return;
}

Assistant:

void helicsFederateSetLoggingCallback(HelicsFederate fed,
                                      void (*logger)(int loglevel, const char* identifier, const char* message, void* userdata),
                                      void* userdata,
                                      HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (logger == nullptr) {
            fedptr->setLoggingCallback({});
        } else {
            fedptr->setLoggingCallback([logger, userdata](int loglevel, std::string_view ident, std::string_view message) {
                const std::string identifier(ident);
                const std::string mess(message);
                logger(loglevel, identifier.c_str(), mess.c_str(), userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}